

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

void insert_empty_rule(void)

{
  bucket *pbVar1;
  bucket **local_18;
  bucket **bpp;
  bucket *bp;
  
  if (cache != (char *)0x0) {
    gensym = gensym + 1;
    sprintf(cache,"$$%d");
    pbVar1 = make_bucket(cache);
    last_symbol->next = pbVar1;
    last_symbol = pbVar1;
    pbVar1->tag = plhs[nrules]->tag;
    pbVar1->class = '\x03';
    pbVar1->args = 0;
    pbVar1->trialaction = trialaction;
    nitems = nitems + 2;
    if (maxitems < nitems) {
      expand_items();
    }
    local_18 = pitem + (long)nitems + -2;
    pitem[(long)nitems + -1] = pbVar1;
    for (; *local_18 = local_18[-1], local_18[-1] != (bucket *)0x0; local_18 = local_18 + -1) {
    }
    nrules = nrules + 1;
    if (maxrules <= nrules) {
      expand_rules();
    }
    plhs[nrules] = plhs[nrules + -1];
    plhs[nrules + -1] = pbVar1;
    rprec[nrules] = rprec[nrules + -1];
    rprec[nrules + -1] = 0;
    rassoc[nrules] = rassoc[nrules + -1];
    rassoc[nrules + -1] = '\0';
    return;
  }
  __assert_fail("cache",
                "/workspace/llm4binary/github/license_c_cmakelists/ChrisDodd[P]btyacc/reader.c",
                0x54d,"void insert_empty_rule()");
}

Assistant:

void insert_empty_rule()
{
    register bucket *bp, **bpp;

    assert(cache);
    sprintf(cache, "$$%d", ++gensym);
    bp = make_bucket(cache);
    last_symbol->next = bp;
    last_symbol = bp;
    bp->tag = plhs[nrules]->tag;
    bp->class = ACTION;
    bp->args = 0;
    bp->trialaction = trialaction;

    if ((nitems += 2) > maxitems)
	expand_items();
    bpp = pitem + nitems - 1;
    *bpp-- = bp;
    while ((bpp[0] = bpp[-1])) --bpp;

    if (++nrules >= maxrules)
	expand_rules();
    plhs[nrules] = plhs[nrules-1];
    plhs[nrules-1] = bp;
    rprec[nrules] = rprec[nrules-1];
    rprec[nrules-1] = 0;
    rassoc[nrules] = rassoc[nrules-1];
    rassoc[nrules-1] = TOKEN;
}